

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSatLut.c
# Opt level: O3

int Sbl_ManCriticalFanin(Sbl_Man_t *p,int iLut,Vec_Int_t *vFanins)

{
  uint uVar1;
  uint uVar2;
  int *piVar3;
  long lVar4;
  
  if (-1 < iLut) {
    uVar1 = p->vArrs->nSize;
    if (iLut < (int)uVar1) {
      if (0 < (long)vFanins->nSize) {
        piVar3 = p->vArrs->pArray;
        lVar4 = 0;
        do {
          uVar2 = vFanins->pArray[lVar4];
          if (((long)(int)uVar2 < 0) || (uVar1 <= uVar2)) goto LAB_007bf37b;
          if (piVar3[(int)uVar2] + 1 == piVar3[(uint)iLut]) {
            return uVar2;
          }
          lVar4 = lVar4 + 1;
        } while (vFanins->nSize != lVar4);
      }
      return -1;
    }
  }
LAB_007bf37b:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

int Sbl_ManCriticalFanin( Sbl_Man_t * p, int iLut, Vec_Int_t * vFanins )
{
    int k, iFan, Delay = Vec_IntEntry(p->vArrs, iLut);
    Vec_IntForEachEntry( vFanins, iFan, k )
        if ( Vec_IntEntry(p->vArrs, iFan) + 1 == Delay )
            return iFan;
    return -1;
}